

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

double trng::math::detail::Beta_I<double>(double x,double p,double q,double norm)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if ((((1.0 < x) || (x < 0.0)) || (p <= 0.0)) || (q <= 0.0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x21;
    dVar7 = NAN;
  }
  else {
    dVar12 = p + q;
    dVar5 = dVar12 * x;
    dVar7 = q;
    dVar6 = 1.0 - x;
    dVar14 = p;
    if (p < dVar5) {
      dVar7 = p;
      dVar6 = x;
      dVar14 = q;
      x = 1.0 - x;
    }
    iVar1 = (int)(dVar6 * dVar12 + dVar7);
    dVar9 = x;
    if (iVar1 != 0) {
      dVar9 = x / dVar6;
    }
    dVar11 = 1.0;
    dVar10 = 1.0;
    dVar8 = 1.0;
    dVar13 = dVar7 + -1.0;
    while( true ) {
      dVar11 = ((dVar13 * dVar9) / (dVar14 + dVar10)) * dVar11;
      dVar8 = dVar8 + dVar11;
      if ((ABS(dVar11) <= 8.881784197001252e-16) && (ABS(dVar11) <= dVar8 * 8.881784197001252e-16))
      break;
      dVar10 = dVar10 + 1.0;
      iVar2 = iVar1 + -1;
      if (iVar1 < 1) {
        dVar13 = dVar12;
        iVar1 = iVar2;
        dVar12 = dVar12 + 1.0;
      }
      else {
        dVar13 = dVar7 - dVar10;
        iVar1 = iVar2;
        if (iVar2 == 0) {
          dVar9 = x;
        }
      }
    }
    dVar12 = log(x);
    dVar6 = log(dVar6);
    dVar7 = exp(dVar6 * (dVar7 + -1.0) + dVar12 * dVar14);
    dVar8 = dVar8 * ((dVar7 / dVar14) / norm);
    uVar4 = -(ulong)(p < dVar5);
    dVar7 = (double)(uVar4 & (ulong)(1.0 - dVar8) | ~uVar4 & (ulong)dVar8);
  }
  return dVar7;
}

Assistant:

TRNG_CUDA_ENABLE T Beta_I(T x, T p, T q, T norm) {
        if (p <= 0 or q <= 0 or x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        const T eps{4 * numeric_limits<T>::epsilon()};
        T psq{p + q}, cx{1 - x};
        const bool flag{p < psq * x};
        if (flag) {
          // use  I(x, p, q) = 1 - I(1 - x, q, p)
          utility::swap(x, cx);
          utility::swap(p, q);
        }
        T term{1}, i{1}, y{1}, rx{x / cx}, temp{q - i};
        int s{static_cast<int>(q + cx * psq)};
        if (s == 0)
          rx = x;
        while (true) {
          term *= temp * rx / (p + i);
          y += term;
          temp = abs(term);
          if (temp <= eps and temp <= eps * y)
            break;
          ++i;
          --s;
          if (s >= 0) {
            temp = q - i;
            if (s == 0)
              rx = x;
          } else {
            temp = psq;
            psq++;
          }
        }
        y *= exp(p * ln(x) + (q - 1) * ln(cx)) / p / norm;
        return flag ? 1 - y : y;
      }